

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glucose.cpp
# Opt level: O0

bool __thiscall Gluco::Solver::satisfied(Solver *this,Clause *c)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  bool local_51;
  lbool local_41;
  int local_40;
  lbool local_39;
  int local_38;
  lbool local_31;
  int i;
  lbool local_2a;
  lbool local_29;
  int local_28;
  lbool local_21;
  Clause *local_20;
  Clause *c_local;
  Solver *this_local;
  
  local_20 = c;
  c_local = (Clause *)this;
  if (this->incremental == 0) {
    for (local_38 = 0; iVar1 = local_38, iVar3 = Clause::size(local_20), iVar1 < iVar3;
        local_38 = local_38 + 1) {
      local_40 = (int)Clause::operator[](local_20,local_38);
      local_39 = value(this,(Lit)local_40);
      lbool::lbool(&local_41,'\0');
      bVar2 = lbool::operator==(&local_39,local_41);
      if (bVar2) {
        return true;
      }
    }
    this_local._7_1_ = false;
  }
  else {
    local_28 = (int)Clause::operator[](c,0);
    local_21 = value(this,(Lit)local_28);
    lbool::lbool(&local_29,'\0');
    bVar2 = lbool::operator==(&local_21,local_29);
    local_51 = true;
    if (!bVar2) {
      i = (int)Clause::operator[](local_20,1);
      local_2a = value(this,(Lit)i);
      lbool::lbool(&local_31,'\0');
      local_51 = lbool::operator==(&local_2a,local_31);
    }
    this_local._7_1_ = local_51;
  }
  return this_local._7_1_;
}

Assistant:

bool Solver::satisfied(const Clause& c) const {
  if(incremental)  // Check clauses with many selectors is too time consuming
    return (value(c[0]) == l_True) || (value(c[1]) == l_True);

  // Default mode.
    for (int i = 0; i < c.size(); i++)
        if (value(c[i]) == l_True)
            return true;
    return false; 
}